

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

PackageSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::PackageSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::NetType_const&,slang::ast::VariableLifetime>
          (BumpAllocator *this,Compilation *args,
          basic_string_view<char,_std::char_traits<char>_> *args_1,SourceLocation *args_2,
          NetType *args_3,VariableLifetime *args_4)

{
  VariableLifetime VVar1;
  SourceLocation SVar2;
  size_t sVar3;
  char *pcVar4;
  PackageSymbol *thisSym_;
  
  thisSym_ = (PackageSymbol *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((PackageSymbol *)this->endPtr < thisSym_ + 1) {
    thisSym_ = (PackageSymbol *)allocateSlow(this,0xa8,8);
  }
  else {
    this->head->current = (byte *)(thisSym_ + 1);
  }
  sVar3 = args_1->_M_len;
  pcVar4 = args_1->_M_str;
  SVar2 = *args_2;
  VVar1 = *args_4;
  (thisSym_->super_Symbol).kind = Package;
  (thisSym_->super_Symbol).name._M_len = sVar3;
  (thisSym_->super_Symbol).name._M_str = pcVar4;
  (thisSym_->super_Symbol).location = SVar2;
  (thisSym_->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (thisSym_->super_Symbol).parentScope = (Scope *)0x0;
  (thisSym_->super_Symbol).nextInScope = (Symbol *)0x0;
  (thisSym_->super_Symbol).indexInScope = 0;
  ast::Scope::Scope(&thisSym_->super_Scope,args,&thisSym_->super_Symbol);
  thisSym_->defaultNetType = args_3;
  (thisSym_->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
  super__Optional_payload_base<slang::TimeScale>._M_engaged = false;
  thisSym_->defaultLifetime = VVar1;
  (thisSym_->exportDecls)._M_ptr = (pointer)0x0;
  (thisSym_->exportDecls)._M_extent._M_extent_value = 0;
  thisSym_->hasExportAll = false;
  return thisSym_;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }